

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

string * __thiscall
punky::obj::type_to_string_abi_cxx11_(string *__return_storage_ptr__,obj *this,ObjectType *type)

{
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  obj *local_18;
  ObjectType *type_local;
  
  local_18 = this;
  type_local = (ObjectType *)__return_storage_ptr__;
  switch(*(undefined4 *)this) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"boolean",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"return",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"error",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"fn",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Default",&local_33);
    std::allocator<char>::~allocator(&local_33);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string type_to_string(const ObjectType& type)
{
    switch (type)
    {
        case ObjectType::Int:
            return "int";

        case ObjectType::Boolean:
            return "boolean";

        case ObjectType::Return:
            return "return";

        case ObjectType::Error:
            return "error";

        case ObjectType::Function:
            return "fn";

        case ObjectType::Null:
            return "null";

        case ObjectType::EmptyOut:
            return "";

        default:
            return "Default";
    }
}